

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall upb::generator::Output::operator()(Output *this,string_view format,char **arg)

{
  Arg *in_R8;
  string_view format_00;
  Arg local_98;
  lts_20240722 *local_68;
  char *pcStack_60;
  string local_58;
  string_view local_38;
  char **local_28;
  char **arg_local;
  Output *this_local;
  string_view format_local;
  
  pcStack_60 = format._M_str;
  local_68 = (lts_20240722 *)format._M_len;
  local_28 = arg;
  arg_local = (char **)this;
  this_local = (Output *)local_68;
  format_local._M_len = (size_t)pcStack_60;
  absl::lts_20240722::substitute_internal::Arg::Arg(&local_98,*arg);
  format_00._M_str = (char *)&local_98;
  format_00._M_len = (size_t)pcStack_60;
  absl::lts_20240722::Substitute_abi_cxx11_(&local_58,local_68,format_00,in_R8);
  local_38 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
  Write(this,local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }